

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  ushort uVar4;
  SegmentId id;
  uint uVar5;
  uint uVar6;
  CapTableBuilder *pCVar7;
  ElementSize EVar8;
  SegmentBuilder *this_00;
  word *pwVar9;
  ulong uVar10;
  SegmentBuilder **ppSVar11;
  OrphanBuilder *pOVar12;
  Fault f;
  Fault local_38;
  
  uVar5 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar5 != 0) {
    this_00 = this->segment;
    pCVar7 = this->capTable;
    if ((uVar5 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar5 = (uint)(this->tag).content;
      pwVar9 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar5 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar9->content + uVar10);
      pOVar12 = (OrphanBuilder *)((long)&pwVar9[1].content + uVar10);
      if ((uVar5 & 4) == 0) {
        pwVar9 = &pOVar12->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar12 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar9 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar9 = this->location;
      pOVar12 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pOVar12->tag).content & 3) == 1) {
      uVar5 = *(uint *)((long)&(pOVar12->tag).content + 4);
      EVar8 = (ElementSize)uVar5 & INLINE_COMPOSITE;
      if (EVar8 == INLINE_COMPOSITE) {
        uVar5 = (uint)pwVar9->content;
        if ((uVar5 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x502,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_38);
        }
        ppSVar11 = (SegmentBuilder **)(pwVar9 + 1);
        uVar2 = *(ushort *)((long)&pwVar9->content + 4);
        SVar3 = *(StructPointerCount *)((long)&pwVar9->content + 6);
        switch(elementSize) {
        case BIT:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x510,FAILED,(char *)0x0,
                     "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])
                      "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&local_38);
          break;
        case BYTE:
        case TWO_BYTES:
        case FOUR_BYTES:
        case EIGHT_BYTES:
          if ((ulong)uVar2 != 0) goto switchD_00280d2e_default;
          asList();
          break;
        case POINTER:
          if (SVar3 != 0) {
            ppSVar11 = ppSVar11 + uVar2;
            goto switchD_00280d2e_default;
          }
          asList();
          break;
        case INLINE_COMPOSITE:
          kj::_::unreachable();
        default:
switchD_00280d2e_default:
          uVar4 = *(ushort *)((long)&pwVar9->content + 6);
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = pCVar7;
          __return_storage_ptr__->ptr = (byte *)ppSVar11;
          __return_storage_ptr__->elementCount = uVar5 >> 2 & 0x1fffffff;
          __return_storage_ptr__->step = ((uint)uVar4 + (uint)uVar2) * 0x40;
          __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
          __return_storage_ptr__->structPointerCount = SVar3;
          __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
          goto LAB_00280e42;
        }
      }
      else {
        uVar6 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar8 * 4);
        if (elementSize == BIT) {
          if (EVar8 == BIT) {
LAB_00280db3:
            __return_storage_ptr__->segment = this_00;
            __return_storage_ptr__->capTable = pCVar7;
            __return_storage_ptr__->ptr = (byte *)pwVar9;
            __return_storage_ptr__->elementCount = uVar5 >> 3;
            __return_storage_ptr__->step = (uint)(EVar8 == POINTER) * 0x40 + uVar6;
            __return_storage_ptr__->structDataSize = uVar6;
            __return_storage_ptr__->structPointerCount = (ushort)(EVar8 == POINTER);
            __return_storage_ptr__->elementSize = EVar8;
            goto LAB_00280e42;
          }
          asList();
        }
        else if (EVar8 == BIT) {
          asList();
        }
        else if (uVar6 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
          asList();
        }
        else {
          if ((elementSize != POINTER) || (EVar8 == POINTER)) goto LAB_00280db3;
          asList();
        }
      }
    }
    else {
      asList();
    }
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
LAB_00280e42:
  if ((__return_storage_ptr__->elementSize == INLINE_COMPOSITE) &&
     (__return_storage_ptr__->ptr != (byte *)0x0)) {
    pwVar9 = (word *)(__return_storage_ptr__->ptr + -8);
  }
  else {
    pwVar9 = (word *)__return_storage_ptr__->ptr;
  }
  this->location = pwVar9;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asList(ElementSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  // (Actually, currently this is not true for primitive lists, but let's not turn into a bug if
  // it changes!)
  location = result.getLocation();

  return result;
}